

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dense.hpp
# Opt level: O1

matrix_type * __thiscall
Disa::Matrix_Dense<double,2ul,3ul>::operator*=
          (Matrix_Dense<double,2ul,3ul> *this,Matrix_Dense<double,_2UL,_3UL> *matrix)

{
  double dVar1;
  Matrix_Dense<double,2ul,3ul> *pMVar2;
  long lVar3;
  Vector_Dense<double,_3UL> *pVVar4;
  long lVar5;
  size_t i_column;
  long lVar6;
  bool bVar7;
  double local_38 [4];
  undefined8 local_18;
  undefined8 uStack_10;
  
  pMVar2 = this;
  local_18 = *(undefined8 *)(this + 0x20);
  uStack_10 = *(undefined8 *)(this + 0x28);
  local_38[2] = (double)*(undefined8 *)(this + 0x10);
  local_38[3] = (double)*(undefined8 *)(this + 0x18);
  local_38[0] = *(double *)this;
  local_38[1] = (double)*(undefined8 *)(this + 8);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  lVar3 = 0;
  do {
    pVVar4 = (Vector_Dense<double,_3UL> *)matrix;
    lVar5 = 0;
    do {
      dVar1 = local_38[lVar3 * 3 + lVar5];
      lVar6 = 0;
      do {
        if (lVar5 == 0) {
          *(undefined8 *)(this + lVar6 * 8) = 0;
        }
        *(double *)(this + lVar6 * 8) =
             ((array<Disa::Vector_Dense<double,_3UL>,_2UL> *)&pVVar4->super_array<double,_3UL>)->
             _M_elems[0].super_array<double,_3UL>._M_elems[lVar6] * dVar1 +
             *(double *)(this + lVar6 * 8);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
      pVVar4 = pVVar4 + 1;
      bVar7 = lVar5 == 0;
      lVar5 = lVar5 + 1;
    } while (bVar7);
    this = this + 0x18;
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  return (matrix_type *)pMVar2;
}

Assistant:

constexpr matrix_type& operator*=(const Matrix_Dense<_type, _row_other, _col_other>& matrix) {
    // For static containers the matrices must be square.
    ASSERT_DEBUG(size() == matrix.size(), "Incompatible matrix dimensions, " + std::to_string(size_row()) + "," +
                                          std::to_string(size_column()) + " vs. " + std::to_string(matrix.size_row()) +
                                          "," + std::to_string(matrix.size_column()) + ".");
    matrix_type copy;
    std::swap(*this, copy);
    FOR(i_row, size_row()) {
      FOR(i_row_other, matrix.size_row()) {
        FOR(i_column, size_column()) {
          if(i_row_other == 0) (*this)[i_row][i_column] = 0.0;
          (*this)[i_row][i_column] += copy[i_row][i_row_other] * matrix[i_row_other][i_column];
        }
      }
    }
    return *this;
  }